

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O2

void __thiscall
ktx::CommandValidate::OptionsValidate::process
          (OptionsValidate *this,Options *param_1,ParseResult *args,Reporter *param_3)

{
  OptionValue *pOVar1;
  bool *pbVar2;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"warnings-as-errors",&local_31);
  pOVar1 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar2 = cxxopts::OptionValue::as<bool>(pOVar1);
  this->warningsAsErrors = *pbVar2;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"gltf-basisu",&local_31);
  pOVar1 = cxxopts::ParseResult::operator[](args,&local_30);
  pbVar2 = cxxopts::OptionValue::as<bool>(pOVar1);
  this->GLTFBasisU = *pbVar2;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter&) {
            warningsAsErrors = args["warnings-as-errors"].as<bool>();
            GLTFBasisU = args["gltf-basisu"].as<bool>();
        }